

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)22>_> * __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleComputeInstance::createDescriptorSet
          (Move<vk::Handle<(vk::HandleType)22>_> *__return_storage_ptr__,
          ImageSampleComputeInstance *this,VkDescriptorPool pool,VkDescriptorSetLayout layout)

{
  Handle<(vk::HandleType)22> *pHVar1;
  VkPipelineLayout local_70;
  VkDescriptorSetLayout local_68;
  VkDescriptorSet local_60;
  undefined1 local_51;
  undefined1 local_50 [8];
  VkDescriptorSetAllocateInfo allocInfo;
  ImageSampleComputeInstance *this_local;
  VkDescriptorSetLayout layout_local;
  VkDescriptorPool pool_local;
  Move<vk::Handle<(vk::HandleType)22>_> *descriptorSet;
  
  local_50._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  allocInfo.descriptorPool.m_internal._0_4_ = 1;
  allocInfo._24_8_ = &this_local;
  allocInfo.pNext = (void *)pool.m_internal;
  allocInfo.pSetLayouts = (VkDescriptorSetLayout *)this;
  this_local = (ImageSampleComputeInstance *)layout.m_internal;
  layout_local.m_internal = pool.m_internal;
  if ((this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) ||
     (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)) {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move(__return_storage_ptr__);
  }
  else {
    local_51 = 0;
    ::vk::allocateDescriptorSet
              (__return_storage_ptr__,this->m_vki,this->m_device,
               (VkDescriptorSetAllocateInfo *)local_50);
    pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    local_60.m_internal = pHVar1->m_internal;
    local_68.m_internal = (deUint64)this_local;
    ::vk::Handle<(vk::HandleType)16>::Handle(&local_70,0);
    writeDescriptorSet(this,local_60,local_68,local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

vk::Move<vk::VkDescriptorSet> ImageSampleComputeInstance::createDescriptorSet (vk::VkDescriptorPool pool, vk::VkDescriptorSetLayout layout)
{
	const vk::VkDescriptorSetAllocateInfo	allocInfo		=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
		DE_NULL,
		pool,
		1u,
		&layout
	};

	if (m_updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE && m_updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)
	{
		vk::Move<vk::VkDescriptorSet>			descriptorSet	= allocateDescriptorSet(m_vki, m_device, &allocInfo);
		writeDescriptorSet(*descriptorSet, layout);

		return descriptorSet;
	}

	return vk::Move<vk::VkDescriptorSet>();
}